

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O2

void msdfgen::generatePseudoSDF
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  SignedDistance b;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  EdgeSegment *pEVar5;
  float *pfVar6;
  int iVar7;
  EdgeHolder *this;
  int i;
  uint uVar8;
  pointer pCVar9;
  EdgeHolder *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  Vector2 VVar15;
  SignedDistance a;
  SignedDistance local_148;
  uint local_134;
  ulong local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint local_f4;
  uint local_f0;
  int local_ec;
  vector<double,_std::allocator<double>_> contourSD;
  vector<int,_std::allocator<int>_> windings;
  double local_b0;
  double local_58;
  double param;
  
  uVar4 = ((long)(shape->contours).
                 super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  iVar2 = Bitmap<float>::width(output);
  local_134 = Bitmap<float>::height(output);
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar7 = (int)uVar4;
  std::vector<int,_std::allocator<int>_>::reserve(&windings,(long)iVar7);
  for (pCVar9 = (shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar9 != (shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
    iVar3 = Contour::winding(pCVar9);
    contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(contourSD.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&windings,(int *)&contourSD);
  }
  contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&contourSD,(long)iVar7);
  local_130 = uVar4 & 0xffffffff;
  if (iVar7 < 1) {
    local_130 = 0;
  }
  uVar8 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  local_f4 = 0;
  if (0 < (int)local_134) {
    local_f4 = local_134;
  }
  do {
    if (uVar8 == local_f4) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&contourSD.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&windings.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    local_f0 = ~uVar8 + local_134;
    if (shape->inverseYAxis == false) {
      local_f0 = uVar8;
    }
    for (iVar7 = 0; iVar7 != iVar2; iVar7 = iVar7 + 1) {
      Vector2::Vector2((Vector2 *)&param,(double)iVar7 + 0.5,(double)(int)uVar8 + 0.5);
      VVar15 = Vector2::operator/((Vector2 *)&param,scale);
      local_148.dot = VVar15.y;
      local_148.distance = VVar15.x;
      VVar15 = Vector2::operator-((Vector2 *)&local_148,translate);
      local_108 = 1e+240;
      uStack_100 = 0x8000000000000000;
      pCVar9 = (shape->contours).
               super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = 0;
      local_128 = -1e+240;
      uStack_120 = 0;
      local_58 = -1e+240;
      local_ec = iVar7;
      for (uVar4 = 0; iVar7 = local_ec, uVar4 != local_130; uVar4 = uVar4 + 1) {
        SignedDistance::SignedDistance(&local_148);
        this_00 = *(EdgeHolder **)
                   &(pCVar9->edges).
                    super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>;
        local_b0 = 0.0;
        this = (EdgeHolder *)0x0;
        for (; this_00 !=
               (pCVar9->edges).
               super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl
               .super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
          pEVar5 = EdgeHolder::operator->(this_00);
          dVar14 = VVar15.y;
          (*pEVar5->_vptr_EdgeSegment[5])(VVar15.x._0_4_,pEVar5,(Vector2 *)&param);
          b.dot = local_148.dot;
          b.distance = local_148.distance;
          local_118 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          a.dot = dVar14;
          a.distance = local_118;
          bVar1 = operator<(a,b);
          if (bVar1) {
            local_148.distance = local_118;
            local_b0 = param;
            this = this_00;
            local_148.dot = dVar14;
          }
        }
        uVar10 = SUB84(local_148.distance,0);
        uVar11 = (undefined4)((ulong)local_148.distance >> 0x20);
        if (ABS(local_148.distance) < ABS(local_58)) {
          iVar3 = -windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
          local_58 = local_148.distance;
        }
        if (this != (EdgeHolder *)0x0) {
          pEVar5 = EdgeHolder::operator->(this);
          (*pEVar5->_vptr_EdgeSegment[6])(VVar15.x._0_4_,VVar15.y,local_b0,pEVar5,&local_148);
          uVar10 = SUB84(local_148.distance,0);
          uVar11 = (undefined4)((ulong)local_148.distance >> 0x20);
        }
        contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = (double)CONCAT44(uVar11,uVar10);
        if ((windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4] < 1) || (local_148.distance < 0.0)) {
          if ((windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] < 0) &&
             ((local_148.distance <= 0.0 && (ABS(local_148.distance) < ABS(local_108))))) {
            local_108 = local_148.distance;
            uStack_100 = 0;
          }
        }
        else if (ABS(local_148.distance) < ABS(local_128)) {
          local_128 = local_148.distance;
          uStack_120 = 0;
        }
        pCVar9 = pCVar9 + 1;
      }
      local_118 = -1e+240;
      uStack_110 = 0;
      if ((local_128 < 0.0) || (ABS(local_108) < ABS(local_128))) {
        if ((local_108 <= 0.0) && (ABS(local_108) <= ABS(local_128))) {
          uVar4 = 0;
          while( true ) {
            if (local_130 == uVar4) break;
            if (((windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4] < 0) &&
                (dVar14 = contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4], dVar14 < local_108)) &&
               (ABS(dVar14) < ABS(local_128))) {
              uStack_100 = 0;
              local_108 = dVar14;
            }
            uVar4 = uVar4 + 1;
          }
          iVar3 = -1;
          uVar10 = (undefined4)local_108;
          uVar11 = local_108._4_4_;
          uVar12 = (undefined4)uStack_100;
          uVar13 = uStack_100._4_4_;
          goto LAB_00163dbe;
        }
      }
      else {
        for (uVar4 = 0; local_130 != uVar4; uVar4 = uVar4 + 1) {
          if (((0 < windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4]) &&
              (dVar14 = contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4], local_128 < dVar14)) &&
             (ABS(dVar14) < ABS(local_108))) {
            uStack_120 = 0;
            local_128 = dVar14;
          }
        }
        iVar3 = 1;
        uVar10 = (undefined4)local_128;
        uVar11 = local_128._4_4_;
        uVar12 = (undefined4)uStack_120;
        uVar13 = uStack_120._4_4_;
LAB_00163dbe:
        local_118 = (double)CONCAT44(uVar11,uVar10);
        uStack_110 = CONCAT44(uVar13,uVar12);
      }
      for (uVar4 = 0; local_130 != uVar4; uVar4 = uVar4 + 1) {
        if ((windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar4] != iVar3) &&
           (ABS(contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]) < ABS(local_118))) {
          uStack_110 = 0;
          local_118 = contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
        }
      }
      pfVar6 = Bitmap<float>::operator()(output,local_ec,local_f0);
      *pfVar6 = (float)(local_118 / range + 0.5);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void generatePseudoSDF(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<double> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;
                double sd = SignedDistance::INFINITE.distance;
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge = NULL;
                    double nearParam = 0;
                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if (distance < minDistance) {
                            minDistance = distance;
                            nearEdge = &*edge;
                            nearParam = param;
                        }
                    }
                    if (fabs(minDistance.distance) < fabs(sd)) {
                        sd = minDistance.distance;
                        winding = -windings[i];
                    }
                    if (nearEdge)
                        (*nearEdge)->distanceToPseudoDistance(minDistance, p, nearParam);
                    contourSD[i] = minDistance.distance;
                    if (windings[i] > 0 && minDistance.distance >= 0 && fabs(minDistance.distance) < fabs(posDist))
                        posDist = minDistance.distance;
                    if (windings[i] < 0 && minDistance.distance <= 0 && fabs(minDistance.distance) < fabs(negDist))
                        negDist = minDistance.distance;
                }

                double psd = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    psd = posDist;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i] > psd && fabs(contourSD[i]) < fabs(negDist))
                            psd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    psd = negDist;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i] < psd && fabs(contourSD[i]) < fabs(posDist))
                            psd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i]) < fabs(psd))
                        psd = contourSD[i];

                output(x, row) = float(psd/range+.5);
            }
        }
    }
}